

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

BOOL __thiscall Js::ScriptContext::CheckObject(ScriptContext *this,Var object)

{
  bool bVar1;
  Var local_18;
  Var object_local;
  ScriptContext *this_local;
  
  local_18 = object;
  object_local = this;
  bVar1 = JsUtil::Stack<void_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Contains
                    (this->operationStack,&local_18);
  return (BOOL)bVar1;
}

Assistant:

BOOL ScriptContext::CheckObject(Var object)
    {
        return operationStack->Contains(object);
    }